

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsed_certificate_unittest.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::ParsedCertificateTest_Policies_Test::TestBody
          (ParsedCertificateTest_Policies_Test *this)

{
  bool bVar1;
  pointer *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar2;
  char *in_R9;
  pointer *__ptr_2;
  Input extension_oid;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  ParsedExtension extension;
  shared_ptr<const_bssl::ParsedCertificate> cert;
  AssertHelper local_98;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  AssertHelper local_80;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  bool local_38;
  ParsedCertificate *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  local_58 = (undefined1  [8])&local_48;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"policies.pem","");
  local_78 = (undefined1  [8])((ulong)local_78 & 0xffffffffffffff00);
  ParseCertificateFromFile
            ((anon_unknown_0 *)&local_28,(string *)local_58,(ParseCertificateOptions *)local_78);
  if (local_58 != (undefined1  [8])&local_48) {
    operator_delete((void *)local_58,local_48._M_allocated_capacity + 1);
  }
  local_78[0] = local_28 != (ParsedCertificate *)0x0;
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28 == (ParsedCertificate *)0x0) {
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_70;
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_58,(internal *)local_78,(AssertionResult *)0x5ab4af,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parsed_certificate_unittest.cc"
               ,0x113,(char *)local_58);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_58 != (undefined1  [8])&local_48) {
      operator_delete((void *)local_58,local_48._M_allocated_capacity + 1);
    }
    if (local_90._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90._M_head_impl + 8))();
    }
    __ptr_00 = local_70;
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0029581d;
  }
  else {
    local_90._M_head_impl._0_4_ = 4;
    local_78 = (undefined1  [8])
               (local_28->extensions_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_58,"4u","cert->extensions().size()",(uint *)&local_90,
               (unsigned_long *)local_78);
    if (local_58[0] == (string)0x0) {
      testing::Message::Message((Message *)local_78);
      if (pbStack_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (pbStack_50->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parsed_certificate_unittest.cc"
                 ,0x115,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)local_78);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_78 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_78 + 8))();
      }
      if (pbStack_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      goto LAB_0029581d;
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&pbStack_50;
      __ptr_00 = pbStack_50;
    }
    else {
      if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_50,pbStack_50);
      }
      local_48._M_allocated_capacity = 0;
      local_48._8_8_ = (long *)0x0;
      local_58 = (undefined1  [8])0x0;
      pbStack_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_38 = false;
      extension_oid.data_.size_ = 3;
      extension_oid.data_.data_ = "U\x1d St19bad_optional_access";
      bVar1 = ParsedCertificate::GetExtension(local_28,extension_oid,(ParsedExtension *)local_58);
      local_90._M_head_impl._0_1_ = bVar1;
      local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!bVar1) {
        testing::Message::Message((Message *)&local_98);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_78,(internal *)&local_90,
                   (AssertionResult *)
                   "cert->GetExtension(der::Input(kCertificatePoliciesOid), &extension)","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parsed_certificate_unittest.cc"
                   ,0x119,(char *)local_78);
        testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        if (local_78 != (undefined1  [8])&local_68) {
          operator_delete((void *)local_78,local_68._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT44(local_98.data_._4_4_,local_98.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,local_98.data_._0_4_) + 8))();
        }
        if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          ::std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_88,local_88);
        }
        if (!bVar1) goto LAB_0029581d;
      }
      local_90._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (CONCAT71(local_90._M_head_impl._1_7_,local_38) ^ 1);
      local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_38 != false) {
        testing::Message::Message((Message *)&local_98);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_78,(internal *)&local_90,(AssertionResult *)"extension.critical",
                   "true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parsed_certificate_unittest.cc"
                   ,0x11b,(char *)local_78);
        testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        if (local_78 != (undefined1  [8])&local_68) {
          operator_delete((void *)local_78,local_68._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT44(local_98.data_._4_4_,local_98.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,local_98.data_._0_4_) + 8))();
        }
      }
      if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_88,local_88);
      }
      local_98.data_._0_4_ = 0x5f;
      local_90._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._8_8_
      ;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)local_78,"95u","extension.value.size()",(uint *)&local_98,
                 (unsigned_long *)&local_90);
      if (local_78[0] == false) {
        testing::Message::Message((Message *)&local_90);
        if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = (local_70->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parsed_certificate_unittest.cc"
                   ,0x11c,pcVar2);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        if (local_90._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_90._M_head_impl + 8))();
        }
      }
      if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_70,local_70);
      }
      local_90._M_head_impl._0_1_ = local_28->has_policy_oids_;
      local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_28->has_policy_oids_ == false) {
        testing::Message::Message((Message *)&local_98);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_78,(internal *)&local_90,
                   (AssertionResult *)"cert->has_policy_oids()","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parsed_certificate_unittest.cc"
                   ,0x11e,(char *)local_78);
        testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        if (local_78 != (undefined1  [8])&local_68) {
          operator_delete((void *)local_78,local_68._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT44(local_98.data_._4_4_,local_98.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,local_98.data_._0_4_) + 8))();
        }
      }
      if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_88,local_88);
      }
      local_98.data_._0_4_ = 2;
      if (local_28->has_policy_oids_ == false) {
        abort();
      }
      local_90._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)(local_28->policy_oids_).
                  super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(local_28->policy_oids_).
                  super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
                  super__Vector_impl_data._M_start >> 4);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)local_78,"2u","cert->policy_oids().size()",(uint *)&local_98,
                 (unsigned_long *)&local_90);
      if (local_78[0] == false) {
        testing::Message::Message((Message *)&local_90);
        if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = (local_70->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parsed_certificate_unittest.cc"
                   ,0x11f,pcVar2);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        if (local_90._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_90._M_head_impl + 8))();
        }
      }
      if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      goto LAB_0029581d;
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_70;
      __ptr_00 = local_70;
    }
  }
  ::std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,__ptr_00);
LAB_0029581d:
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(ParsedCertificateTest, SubjectBlankSubjectAltNameNotCritical) {
  ASSERT_FALSE(ParseCertificateFromFile(
      "subject_blank_subjectaltname_not_critical.pem", {}));
}